

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O3

int vf_profile_equal(vf_profile_t lhs,vf_profile_t rhs)

{
  return (int)(((lhs._40_8_ == rhs._40_8_ && lhs.bias == rhs.bias) &&
               (lhs.exp_mask == rhs.exp_mask && lhs.sgn_mask == rhs.sgn_mask)) &&
              lhs.mnt_mask == rhs.mnt_mask);
}

Assistant:

int vf_profile_equal(vf_profile_t lhs, vf_profile_t rhs) {
	int bias_equal = lhs.bias == rhs.bias;
	int bits_equal = lhs.bits == rhs.bits;
	int sgn_bits_equal = lhs.sgn_bits == rhs.sgn_bits;
	int exp_bits_equal = lhs.exp_bits == rhs.exp_bits;
	int mnt_bits_equal = lhs.mnt_bits == rhs.mnt_bits;
	int sgn_mask_equal = lhs.sgn_mask == rhs.sgn_mask;
	int exp_mask_equal = lhs.exp_mask == rhs.exp_mask;
	int mnt_mask_equal = lhs.mnt_mask == rhs.mnt_mask;
	return bias_equal & bits_equal & sgn_bits_equal & exp_bits_equal & mnt_bits_equal & sgn_mask_equal & exp_mask_equal & mnt_mask_equal;
}